

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::iterate(StorageMultisampleTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ContextType ctxType;
  int iVar11;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareVertexArray(this);
    bVar1 = LoopTestOverDOverS<signed_char,false>(this,true);
    bVar2 = LoopTestOverDOverS<unsigned_char,false>(this,true);
    bVar3 = LoopTestOverDOverS<short,false>(this,true);
    bVar4 = LoopTestOverDOverS<unsigned_short,false>(this,true);
    bVar5 = LoopTestOverDOverS<int,false>(this,false);
    bVar6 = LoopTestOverDOverS<unsigned_int,false>(this,false);
    bVar7 = LoopTestOverDOverS<unsigned_char,true>(this,true);
    bVar8 = LoopTestOverDOverS<unsigned_short,true>(this,true);
    bVar9 = LoopTestOverDOverS<float,true>(this,false);
    CleanInputTexture(this);
    CleanAuxiliaryTexture(this);
    CleanFramebuffers(this);
    CleanPrograms(this);
    CleanErrors(this);
    CleanVertexArray(this);
    (**(code **)(CONCAT44(extraout_var,iVar10) + 0x4e8))(0x809d);
    do {
      iVar11 = (**(code **)(CONCAT44(extraout_var,iVar10) + 0x800))();
    } while (iVar11 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar8 && bVar9) && (((bVar5 && bVar6) && bVar7) && ((bVar3 && bVar4) && (bVar1 && bVar2))))
    {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageMultisampleTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareVertexArray();

		//  gl.enable(GL_MULTISAMPLE);

		is_ok &= LoopTestOverDOverS<glw::GLbyte, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLshort, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLint, false>(false);
		is_ok &= LoopTestOverDOverS<glw::GLuint, false>(false);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLfloat, true>(false);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanInputTexture();
	CleanAuxiliaryTexture();
	CleanFramebuffers();
	CleanPrograms();
	CleanErrors();
	CleanVertexArray();
	gl.disable(GL_MULTISAMPLE);

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}